

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::delaunizecavity
          (tetgenmesh *this,arraypool *cavpoints,arraypool *cavfaces,arraypool *cavshells,
          arraypool *newtets,arraypool *crosstets,arraypool *misfaces)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  tetgenbehavior *ptVar5;
  char **ppcVar6;
  point pdVar7;
  long lVar8;
  memorypool *pmVar9;
  undefined8 *puVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  point pdVar14;
  long lVar15;
  shellface ppdVar16;
  shellface pb;
  long lVar17;
  arraypool *paVar18;
  shellface pd;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  ulong *puVar22;
  shellface ppdVar23;
  int *piVar24;
  arraypool *paVar25;
  ulong uVar26;
  double dVar27;
  face tmpsh;
  insertvertexflags ivf;
  shellface local_130;
  triface local_128;
  shellface local_118;
  face local_110;
  arraypool *local_100;
  shellface local_f8 [3];
  arraypool *local_e0;
  arraypool *local_d8;
  long local_d0;
  int local_c8;
  int local_c4;
  shellface local_c0;
  long local_b8;
  long local_b0;
  insertvertexflags local_a8;
  
  local_e0 = crosstets;
  local_d8 = newtets;
  local_128.tet = (tetrahedron *)0x0;
  local_128.ver = 0;
  local_110.sh = (shellface *)0x0;
  local_110.shver = 0;
  local_a8.refinetet.tet = (tetrahedron *)0x0;
  local_a8.refinetet.ver = 0;
  local_a8.refinesh.sh = (shellface *)0x0;
  local_a8.refinesh.shver = 0;
  local_a8.smlenflag = 0;
  local_a8.smlen = 0.0;
  local_a8.iloc = 0;
  local_a8.bowywat = 0;
  local_a8.lawson = 0;
  local_a8.splitbdflag = 0;
  local_a8.validflag = 0;
  local_a8.respectbdflag = 0;
  local_a8.rejflag = 0;
  local_a8.chkencflag = 0;
  local_a8.cdtflag = 0;
  local_a8.assignmeshsize = 0;
  local_a8.sloc = 0;
  local_a8.sbowywat = 0;
  local_a8.refineflag = 0;
  if (2 < this->b->verbose) {
    printf("      Delaunizing cavity: %ld points, %ld faces.\n",cavpoints->objects,cavfaces->objects
          );
  }
  local_b8 = local_e0->objects;
  local_b0 = this->hullsize;
  local_c4 = this->checksubsegflag;
  local_c8 = this->checksubfaceflag;
  this->hullsize = 0;
  this->checksubsegflag = 0;
  this->checksubfaceflag = 0;
  ptVar5 = this->b;
  piVar24 = &ptVar5->verbose;
  *piVar24 = *piVar24 + -1;
  ptVar5->plc = 0;
  local_a8.bowywat = 1;
  uVar20 = cavfaces->objects;
  local_100 = cavshells;
  if ((long)uVar20 < 1) {
    pdVar14 = (point)0x0;
    ppdVar16 = (shellface)0x0;
    ppdVar23 = (shellface)0x0;
    uVar26 = 0;
  }
  else {
    ppcVar6 = cavfaces->toparray;
    iVar11 = cavfaces->log2objectsperblock;
    uVar2 = cavfaces->objectsperblockmark;
    iVar3 = cavfaces->objectbytes;
    pdVar7 = this->dummypoint;
    ppdVar16 = (shellface)0x0;
    uVar26 = 0;
    do {
      pcVar13 = ppcVar6[(uint)uVar26 >> ((byte)iVar11 & 0x1f)];
      lVar21 = (long)(int)((uint)uVar26 & uVar2) * (long)iVar3;
      iVar4 = epivot[*(int *)(pcVar13 + lVar21 + 8)];
      *(int *)(pcVar13 + lVar21 + 8) = iVar4;
      lVar21 = *(long *)(pcVar13 + lVar21);
      pdVar14 = *(point *)(lVar21 + (long)apexpivot[iVar4] * 8);
      if (pdVar14 != pdVar7) {
        ppdVar23 = *(shellface *)(lVar21 + (long)orgpivot[iVar4] * 8);
        ppdVar16 = *(shellface *)(lVar21 + (long)destpivot[iVar4] * 8);
        goto LAB_00135a63;
      }
      uVar26 = uVar26 + 1;
    } while (uVar20 != uVar26);
    pdVar14 = (point)0x0;
    ppdVar23 = (shellface)0x0;
    uVar26 = uVar20;
  }
LAB_00135a63:
  uVar26 = uVar26 & 0xffffffff;
  pb = ppdVar16;
  if ((long)uVar26 < cavfaces->objects) {
    do {
      lVar17 = (long)cavfaces->objectbytes *
               (long)(int)(cavfaces->objectsperblockmark & (uint)uVar26);
      lVar21 = *(long *)(cavfaces->toparray
                         [(uint)uVar26 >> ((byte)cavfaces->log2objectsperblock & 0x1f)] + lVar17);
      iVar11 = *(int *)(cavfaces->toparray
                        [(uint)uVar26 >> ((byte)cavfaces->log2objectsperblock & 0x1f)] + lVar17 + 8)
      ;
      local_f8[0] = *(shellface *)(lVar21 + (long)orgpivot[iVar11] * 8);
      local_f8[1] = *(shellface *)(lVar21 + (long)destpivot[iVar11] * 8);
      local_f8[2] = *(shellface *)(lVar21 + (long)apexpivot[iVar11] * 8);
      lVar21 = 0;
      do {
        ppdVar16 = pb;
        if (local_f8[lVar21] != (shellface)this->dummypoint) {
          dVar27 = orient3d((double *)ppdVar23,(double *)pb,pdVar14,(double *)local_f8[lVar21]);
          if ((dVar27 != 0.0) || (NAN(dVar27))) {
            pd = local_f8[lVar21];
            if (0.0 < dVar27) {
              local_f8[lVar21] = ppdVar23;
              ppdVar16 = ppdVar23;
              ppdVar23 = pb;
            }
            goto LAB_00135b31;
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 3);
      pd = (shellface)0x0;
LAB_00135b31:
      if (pd != (shellface)0x0) goto LAB_00135b56;
      uVar26 = uVar26 + 1;
      pb = ppdVar16;
    } while ((long)uVar26 < cavfaces->objects);
    pd = (shellface)0x0;
  }
  else {
    pd = (shellface)0x0;
  }
LAB_00135b56:
  initialdelaunay(this,(point)ppdVar23,(point)ppdVar16,pdVar14,(point)pd);
  ppdVar23 = local_f8[0];
  if (0 < cavpoints->objects) {
    lVar21 = 0;
    do {
      ppdVar23 = *(shellface *)
                  (cavpoints->toparray
                   [(uint)lVar21 >> ((byte)cavpoints->log2objectsperblock & 0x1f)] +
                  (long)cavpoints->objectbytes *
                  (long)(int)(cavpoints->objectsperblockmark & (uint)lVar21));
      local_128.tet = (this->recenttet).tet;
      local_128.ver = (this->recenttet).ver;
      local_a8.iloc = 1;
      insertpoint(this,(point)ppdVar23,&local_128,(face *)0x0,(face *)0x0,&local_a8);
      lVar21 = lVar21 + 1;
    } while (lVar21 < cavpoints->objects);
  }
  local_f8[0] = ppdVar23;
  if (2 < this->b->verbose) {
    printf("      Identifying %ld boundary faces of the cavity.\n",cavfaces->objects);
  }
  local_c0 = local_f8[1];
  local_130 = local_f8[2];
  local_118 = local_f8[0];
  while( true ) {
    paVar25 = local_100;
    if (0 < cavfaces->objects) {
      lVar21 = 0;
      do {
        lVar15 = (long)cavfaces->objectbytes *
                 (long)(int)(cavfaces->objectsperblockmark & (uint)lVar21);
        lVar17 = *(long *)(cavfaces->toparray
                           [(uint)lVar21 >> ((byte)cavfaces->log2objectsperblock & 0x1f)] + lVar15);
        if ((*(byte *)(lVar17 + (long)this->elemmarkerindex * 4) & 1) == 0) {
          puVar22 = (ulong *)(cavfaces->toparray
                              [(uint)lVar21 >> ((byte)cavfaces->log2objectsperblock & 0x1f)] +
                             lVar15);
          iVar11 = epivot[(int)puVar22[1]];
          *(int *)(puVar22 + 1) = iVar11;
          ppdVar23 = *(shellface *)(lVar17 + (long)orgpivot[iVar11] * 8);
          ppdVar16 = *(shellface *)(lVar17 + (long)destpivot[iVar11] * 8);
          local_130 = *(shellface *)(lVar17 + (long)apexpivot[iVar11] * 8);
          makeshellface(this,this->subfaces,&local_110);
          lVar17 = (long)local_110.shver;
          local_110.sh[sorgpivot[lVar17]] = ppdVar23;
          local_110.sh[sdestpivot[lVar17]] = ppdVar16;
          local_110.sh[sapexpivot[lVar17]] = local_130;
          local_128.tet = (tetrahedron *)0x0;
          local_118 = ppdVar23;
          local_c0 = ppdVar16;
          iVar11 = scoutsubface(this,&local_110,&local_128,0);
          paVar25 = local_100;
          if (iVar11 == 0) {
            piVar24 = (int *)(puVar22 + 1);
            pmVar9 = this->subfaces;
            local_110.sh[3] = (shellface)0x0;
            *local_110.sh = (shellface)pmVar9->deaditemstack;
            pmVar9->deaditemstack = local_110.sh;
            pmVar9->items = pmVar9->items + -1;
            pcVar12 = arraypool::getblock(misfaces,(int)misfaces->objects);
            lVar17 = (long)misfaces->objectbytes *
                     ((long)misfaces->objectsperblock - 1U & misfaces->objects);
            pcVar13 = pcVar12 + lVar17;
            misfaces->objects = misfaces->objects + 1;
            *(ulong *)(pcVar12 + lVar17) = *puVar22;
          }
          else {
            *local_110.sh = (shellface)((long)(int)puVar22[1] | *puVar22);
            pcVar12 = arraypool::getblock(local_100,(int)local_100->objects);
            lVar17 = (long)paVar25->objectbytes *
                     ((long)paVar25->objectsperblock - 1U & paVar25->objects);
            pcVar13 = pcVar12 + lVar17;
            paVar25->objects = paVar25->objects + 1;
            *(shellface **)(pcVar12 + lVar17) = local_110.sh;
            piVar24 = &local_110.shver;
          }
          *(int *)(pcVar13 + 8) = *piVar24;
          paVar25 = local_100;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < cavfaces->objects);
    }
    paVar18 = local_d8;
    if (misfaces->objects < 1) break;
    if (2 < this->b->verbose) {
      printf("      Enlarging the cavity. %ld missing bdry faces\n");
    }
    lVar21 = paVar25->objects;
    if (0 < lVar21) {
      iVar11 = paVar25->log2objectsperblock;
      uVar2 = paVar25->objectsperblockmark;
      iVar3 = paVar25->objectbytes;
      lVar17 = 0;
      do {
        pcVar13 = paVar25->toparray[(uint)lVar17 >> ((byte)iVar11 & 0x1f)];
        lVar15 = (long)(int)((uint)lVar17 & uVar2) * (long)iVar3;
        uVar20 = *(ulong *)(*(long *)(pcVar13 + lVar15) + 0x48 +
                           (ulong)(*(uint *)(pcVar13 + lVar15 + 8) & 1) * 8);
        uVar19 = (uint)uVar20 & 0xf;
        uVar20 = uVar20 & 0xfffffffffffffff0;
        if (uVar20 != 0) {
          uVar19 = stpivottbl[uVar19][(int)*(uint *)(pcVar13 + lVar15 + 8)];
        }
        if (*(long *)(uVar20 + 0x48) != 0) {
          *(undefined8 *)(*(long *)(uVar20 + 0x48) + (ulong)(uVar19 & 3) * 8) = 0;
        }
        uVar20 = *(ulong *)(uVar20 + (ulong)(uVar19 & 3) * 8);
        lVar8 = *(long *)((uVar20 & 0xfffffffffffffff0) + 0x48);
        if (lVar8 != 0) {
          *(undefined8 *)(lVar8 + (ulong)(fsymtbl[(int)uVar19][(uint)uVar20 & 0xf] & 3) * 8) = 0;
        }
        pmVar9 = this->subfaces;
        puVar10 = *(undefined8 **)(pcVar13 + lVar15);
        puVar10[3] = 0;
        *puVar10 = pmVar9->deaditemstack;
        pmVar9->deaditemstack = puVar10;
        pmVar9->items = pmVar9->items + -1;
        lVar17 = lVar17 + 1;
      } while (lVar21 != lVar17);
    }
    paVar25->objects = 0;
    lVar21 = cavpoints->objects;
    if (0 < lVar21) {
      ppcVar6 = cavpoints->toparray;
      lVar17 = 0;
      do {
        local_118 = *(shellface *)
                     (ppcVar6[(uint)lVar17 >> ((byte)cavpoints->log2objectsperblock & 0x1f)] +
                     (long)cavpoints->objectbytes *
                     (long)(int)(cavpoints->objectsperblockmark & (uint)lVar17));
        puVar1 = (uint *)((long)local_118 + (long)this->pointmarkindex * 4 + 4);
        *puVar1 = *puVar1 | 1;
        lVar17 = lVar17 + 1;
      } while (lVar21 != lVar17);
    }
    if (0 < misfaces->objects) {
      lVar21 = 0;
      do {
        paVar25 = local_e0;
        pcVar13 = misfaces->toparray[(uint)lVar21 >> ((byte)misfaces->log2objectsperblock & 0x1f)];
        lVar17 = (long)misfaces->objectbytes *
                 (long)(int)(misfaces->objectsperblockmark & (uint)lVar21);
        uVar2 = *(uint *)(*(long *)(pcVar13 + lVar17) + (long)this->elemmarkerindex * 4);
        local_d0 = lVar21;
        if ((uVar2 & 1) == 0) {
          *(uint *)(*(long *)(pcVar13 + lVar17) + (long)this->elemmarkerindex * 4) = uVar2 | 1;
          pcVar12 = arraypool::getblock(local_e0,(int)local_e0->objects);
          lVar21 = (long)paVar25->objectbytes *
                   ((long)paVar25->objectsperblock - 1U & paVar25->objects);
          paVar25->objects = paVar25->objects + 1;
          *(undefined8 *)(pcVar12 + lVar21) = *(undefined8 *)(pcVar13 + lVar17);
          *(undefined4 *)(pcVar12 + lVar21 + 8) = *(undefined4 *)(pcVar13 + lVar17 + 8);
          pdVar14 = *(point *)(*(long *)(pcVar13 + lVar17) +
                              (long)oppopivot[*(int *)(pcVar13 + lVar17 + 8)] * 8);
          if ((*(byte *)((long)pdVar14 + (long)this->pointmarkindex * 4 + 4) & 1) == 0) {
            local_128.tet = (this->recenttet).tet;
            local_128.ver = (this->recenttet).ver;
            local_a8.iloc = 1;
            insertpoint(this,pdVar14,&local_128,(face *)0x0,(face *)0x0,&local_a8);
            puVar1 = (uint *)((long)pdVar14 + (long)this->pointmarkindex * 4 + 4);
            *puVar1 = *puVar1 | 1;
            pcVar12 = arraypool::getblock(cavpoints,(int)cavpoints->objects);
            uVar20 = cavpoints->objects;
            cavpoints->objects = uVar20 + 1;
            *(point *)(pcVar12 +
                      (long)cavpoints->objectbytes *
                      ((long)cavpoints->objectsperblock - 1U & uVar20)) = pdVar14;
          }
          iVar11 = 3;
          do {
            uVar20 = *(ulong *)(*(long *)(pcVar13 + lVar17) +
                               (ulong)(esymtbl[*(int *)(pcVar13 + lVar17 + 8)] & 3) * 8);
            uVar26 = uVar20 & 0xfffffffffffffff0;
            if ((*(byte *)(uVar26 + (long)this->elemmarkerindex * 4) & 1) == 0) {
              iVar3 = fsymtbl[esymtbl[*(int *)(pcVar13 + lVar17 + 8)]][(uint)uVar20 & 0xf];
              pcVar12 = arraypool::getblock(cavfaces,(int)cavfaces->objects);
              lVar21 = (long)cavfaces->objectbytes *
                       ((long)cavfaces->objectsperblock - 1U & cavfaces->objects);
              cavfaces->objects = cavfaces->objects + 1;
              *(ulong *)(pcVar12 + lVar21) = uVar26;
              *(int *)(pcVar12 + lVar21 + 8) = iVar3;
            }
            *(int *)(pcVar13 + lVar17 + 8) = enexttbl[*(int *)(pcVar13 + lVar17 + 8)];
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
        lVar21 = local_d0 + 1;
      } while (lVar21 < misfaces->objects);
    }
    lVar21 = cavpoints->objects;
    if (0 < lVar21) {
      ppcVar6 = cavpoints->toparray;
      lVar17 = 0;
      do {
        local_118 = *(shellface *)
                     (ppcVar6[(uint)lVar17 >> ((byte)cavpoints->log2objectsperblock & 0x1f)] +
                     (long)cavpoints->objectbytes *
                     (long)(int)(cavpoints->objectsperblockmark & (uint)lVar17));
        puVar1 = (uint *)((long)local_118 + (long)this->pointmarkindex * 4 + 4);
        *puVar1 = *puVar1 & 0xfffffffe;
        lVar17 = lVar17 + 1;
      } while (lVar21 != lVar17);
    }
    misfaces->objects = 0;
  }
  local_f8[1] = local_c0;
  local_f8[2] = local_130;
  local_f8[0] = local_118;
  puVar1 = (uint *)((long)(this->recenttet).tet + (long)this->elemmarkerindex * 4);
  *puVar1 = *puVar1 | 2;
  pcVar13 = arraypool::getblock(local_d8,(int)local_d8->objects);
  paVar25 = local_d8;
  lVar21 = (long)paVar18->objectbytes * ((long)paVar18->objectsperblock - 1U & paVar18->objects);
  paVar18->objects = paVar18->objects + 1;
  *(tetrahedron **)(pcVar13 + lVar21) = (this->recenttet).tet;
  *(int *)(pcVar13 + lVar21 + 8) = (this->recenttet).ver;
  if (0 < paVar18->objects) {
    local_d0 = 0;
    do {
      lVar21 = *(long *)(paVar18->toparray
                         [(uint)local_d0 >> ((byte)paVar18->log2objectsperblock & 0x1f)] +
                        (long)paVar18->objectbytes *
                        (long)(int)(paVar18->objectsperblockmark & (uint)local_d0));
      lVar17 = 0;
      do {
        uVar20 = *(ulong *)(lVar21 + lVar17 * 8);
        uVar26 = uVar20 & 0xfffffffffffffff0;
        uVar2 = *(uint *)(uVar26 + (long)this->elemmarkerindex * 4);
        if ((uVar2 & 2) == 0) {
          *(uint *)(uVar26 + (long)this->elemmarkerindex * 4) = uVar2 | 2;
          pcVar13 = arraypool::getblock(paVar25,(int)paVar25->objects);
          lVar15 = (long)paVar25->objectbytes *
                   ((long)paVar25->objectsperblock - 1U & paVar25->objects);
          paVar25->objects = paVar25->objects + 1;
          *(ulong *)(pcVar13 + lVar15) = uVar26;
          *(uint *)(pcVar13 + lVar15 + 8) = (uint)uVar20 & 0xf;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      local_d0 = local_d0 + 1;
      paVar18 = local_d8;
    } while (local_d0 < local_d8->objects);
  }
  cavpoints->objects = 0;
  cavfaces->objects = 0;
  if (local_b8 < local_e0->objects) {
    this->cavityexpcount = this->cavityexpcount + 1;
  }
  this->hullsize = local_b0;
  this->checksubsegflag = local_c4;
  this->checksubfaceflag = local_c8;
  ptVar5 = this->b;
  piVar24 = &ptVar5->verbose;
  *piVar24 = *piVar24 + 1;
  ptVar5->plc = 1;
  return;
}

Assistant:

void tetgenmesh::delaunizecavity(arraypool *cavpoints, arraypool *cavfaces, 
                                 arraypool *cavshells, arraypool *newtets, 
                                 arraypool *crosstets, arraypool *misfaces)
{
  triface searchtet, neightet, *parytet, *parytet1;
  face tmpsh, *parysh;
  point pa, pb, pc, pd, pt[3], *parypt;
  insertvertexflags ivf;
  REAL ori;
  long baknum, bakhullsize;
  int bakchecksubsegflag, bakchecksubfaceflag;
  int t1ver; 
  int i, j;

  if (b->verbose > 2) {
    printf("      Delaunizing cavity: %ld points, %ld faces.\n", 
           cavpoints->objects, cavfaces->objects);
  }
  // Remember the current number of crossing tets. It may be enlarged later.
  baknum = crosstets->objects;
  bakhullsize = hullsize;
  bakchecksubsegflag = checksubsegflag;
  bakchecksubfaceflag = checksubfaceflag;
  hullsize = 0l;
  checksubsegflag = 0;
  checksubfaceflag = 0;
  b->verbose--;  // Suppress informations for creating Delaunay tetra.
  b->plc = 0; // Do not check near vertices.

  ivf.bowywat = 1; // Use Bowyer-Watson algorithm.

  // Get four non-coplanar points (no dummypoint).
  pa = pb = pc = NULL;
  for (i = 0; i < cavfaces->objects; i++) {
    parytet = (triface *) fastlookup(cavfaces, i);
    parytet->ver = epivot[parytet->ver];
    if (apex(*parytet) != dummypoint) {
      pa = org(*parytet);
      pb = dest(*parytet);
      pc = apex(*parytet);
      break;
    }
  }
  pd = NULL;
  for (; i < cavfaces->objects; i++) {
    parytet = (triface *) fastlookup(cavfaces, i);
    pt[0] = org(*parytet);
    pt[1] = dest(*parytet);
    pt[2] = apex(*parytet);
    for (j = 0; j < 3; j++) {
      if (pt[j] != dummypoint) { // Do not include a hull point.
        ori = orient3d(pa, pb, pc, pt[j]);
        if (ori != 0) {
          pd = pt[j];
          if (ori > 0) {  // Swap pa and pb.
            pt[j] = pa; pa = pb; pb = pt[j]; 
          }
          break;
        }
      }
    }
    if (pd != NULL) break;
  }

  // Create an init DT.
  initialdelaunay(pa, pb, pc, pd);

  // Incrementally insert the vertices (duplicated vertices are ignored).
  for (i = 0; i < cavpoints->objects; i++) {
    pt[0] = * (point *) fastlookup(cavpoints, i);
    searchtet = recenttet;
    ivf.iloc = (int) OUTSIDE;
    insertpoint(pt[0], &searchtet, NULL, NULL, &ivf);
  }

  if (b->verbose > 2) {
    printf("      Identifying %ld boundary faces of the cavity.\n", 
           cavfaces->objects);
  }

  while (1) {

    // Identify boundary faces. Mark interior tets. Save missing faces.
    for (i = 0; i < cavfaces->objects; i++) {
      parytet = (triface *) fastlookup(cavfaces, i);
      // Skip an interior face (due to the enlargement of the cavity).
      if (infected(*parytet)) continue;
      parytet->ver = epivot[parytet->ver];
      pt[0] = org(*parytet);
      pt[1] = dest(*parytet);
      pt[2] = apex(*parytet);
      // Create a temp subface.
      makeshellface(subfaces, &tmpsh);
      setshvertices(tmpsh, pt[0], pt[1], pt[2]);
      // Insert tmpsh in DT.
      searchtet.tet = NULL; 
      if (scoutsubface(&tmpsh, &searchtet, 0)) { // shflag = 0
        // Inserted! 'tmpsh' must face toward the inside of the cavity.
        // Remember the boundary tet (outside the cavity) in tmpsh 
        //   (use the adjacent tet slot). 
        tmpsh.sh[0] = (shellface) encode(*parytet);
        // Save this subface.
        cavshells->newindex((void **) &parysh);
        *parysh = tmpsh;
      } 
      else {
        // This boundary face is missing.
        shellfacedealloc(subfaces, tmpsh.sh);
        // Save this face in list.
        misfaces->newindex((void **) &parytet1);
        *parytet1 = *parytet;
      }
    } // i

    if (misfaces->objects > 0) {
      if (b->verbose > 2) {
        printf("      Enlarging the cavity. %ld missing bdry faces\n", 
               misfaces->objects);
      }

      // Removing all temporary subfaces.
      for (i = 0; i < cavshells->objects; i++) {
        parysh = (face *) fastlookup(cavshells, i);
        stpivot(*parysh, neightet);
        tsdissolve(neightet); // Detach it from adj. tets.
        fsymself(neightet);
        tsdissolve(neightet);
        shellfacedealloc(subfaces, parysh->sh);
      }
      cavshells->restart();

      // Infect the points which are of the cavity.
      for (i = 0; i < cavpoints->objects; i++) {
        pt[0] = * (point *) fastlookup(cavpoints, i);
        pinfect(pt[0]); // Mark it as inserted.
      }

      // Enlarge the cavity.
      for (i = 0; i < misfaces->objects; i++) {
        // Get a missing face.
        parytet = (triface *) fastlookup(misfaces, i);
        if (!infected(*parytet)) {
          // Put it into crossing tet list.
          infect(*parytet);
          crosstets->newindex((void **) &parytet1);
          *parytet1 = *parytet;
          // Insert the opposite point if it is not in DT.
          pd = oppo(*parytet);
          if (!pinfected(pd)) {
            searchtet = recenttet;
            ivf.iloc = (int) OUTSIDE;
            insertpoint(pd, &searchtet, NULL, NULL, &ivf);
            pinfect(pd);
            cavpoints->newindex((void **) &parypt);
            *parypt = pd;
          }
          // Add three opposite faces into the boundary list.
          for (j = 0; j < 3; j++) {
            esym(*parytet, neightet);
            fsymself(neightet);
            if (!infected(neightet)) {
              cavfaces->newindex((void **) &parytet1);
              *parytet1 = neightet;
            } 
            enextself(*parytet);
          } // j
        } // if (!infected(parytet))
      } // i

      // Uninfect the points which are of the cavity.
      for (i = 0; i < cavpoints->objects; i++) {
        pt[0] = * (point *) fastlookup(cavpoints, i);
        puninfect(pt[0]);
      }

      misfaces->restart();
      continue;
    } // if (misfaces->objects > 0)

    break;

  } // while (1)

  // Collect all tets of the DT. All new tets are marktested.
  marktest(recenttet);
  newtets->newindex((void **) &parytet);
  *parytet = recenttet;
  for (i = 0; i < newtets->objects; i++) {
    searchtet = * (triface *) fastlookup(newtets, i);
    for (j = 0; j < 4; j++) {
      decode(searchtet.tet[j], neightet);
      if (!marktested(neightet)) {
        marktest(neightet);
        newtets->newindex((void **) &parytet);
        *parytet = neightet;
      }
    }
  }

  cavpoints->restart();
  cavfaces->restart();

  if (crosstets->objects > baknum) {
    // The cavity has been enlarged.
    cavityexpcount++;
  }

  // Restore the original values.
  hullsize = bakhullsize;
  checksubsegflag = bakchecksubsegflag;
  checksubfaceflag = bakchecksubfaceflag;
  b->verbose++;
  b->plc = 1;
}